

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ResultValueBase<Catch::clara::detail::ParseState> * __thiscall
Catch::clara::detail::ResultValueBase<Catch::clara::detail::ParseState>::operator=
          (ResultValueBase<Catch::clara::detail::ParseState> *this,
          ResultValueBase<Catch::clara::detail::ParseState> *other)

{
  ParseState *in_RSI;
  ResultValueBase<Catch::clara::detail::ParseState> *in_RDI;
  
  if ((in_RDI->super_ResultBase).m_type == Ok) {
    ParseState::~ParseState((ParseState *)0x29e3da);
  }
  ResultBase::operator=(&in_RDI->super_ResultBase,(ResultBase *)in_RSI);
  if ((in_RDI->super_ResultBase).m_type == Ok) {
    ParseState::ParseState(in_RSI,(ParseState *)in_RDI);
  }
  return in_RDI;
}

Assistant:

auto operator=( ResultValueBase const &other ) -> ResultValueBase & {
            if( m_type == ResultBase::Ok )
                m_value.~T();
            ResultBase::operator=(other);
            if( m_type == ResultBase::Ok )
                new( &m_value ) T( other.m_value );
            return *this;
        }